

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_bool nk_button_push_behavior(nk_context *ctx,nk_button_behavior behavior)

{
  int iVar1;
  nk_bool nVar2;
  long lVar3;
  
  nVar2 = 0;
  if (ctx != (nk_context *)0x0) {
    iVar1 = (ctx->stacks).button_behaviors.head;
    lVar3 = (long)iVar1;
    if (lVar3 < 8) {
      (ctx->stacks).button_behaviors.head = iVar1 + 1;
      (ctx->stacks).button_behaviors.elements[lVar3].address = &ctx->button_behavior;
      (ctx->stacks).button_behaviors.elements[lVar3].old_value = ctx->button_behavior;
      ctx->button_behavior = behavior;
      nVar2 = 1;
    }
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_button_push_behavior(struct nk_context *ctx, enum nk_button_behavior behavior)
{
struct nk_config_stack_button_behavior *button_stack;
struct nk_config_stack_button_behavior_element *element;

NK_ASSERT(ctx);
if (!ctx) return 0;

button_stack = &ctx->stacks.button_behaviors;
NK_ASSERT(button_stack->head < (int)NK_LEN(button_stack->elements));
if (button_stack->head >= (int)NK_LEN(button_stack->elements))
return 0;

element = &button_stack->elements[button_stack->head++];
element->address = &ctx->button_behavior;
element->old_value = ctx->button_behavior;
ctx->button_behavior = behavior;
return 1;
}